

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

int readIdentifier(char firstChar)

{
  byte bVar1;
  bool bVar2;
  int local_24;
  ulong uStack_20;
  int c;
  size_t i;
  ushort local_10;
  int tokenType;
  uint16_t nodeID;
  char firstChar_local;
  
  yylval.symName[0] = firstChar;
  bVar1 = dictIndex(firstChar);
  local_10 = keywordDict[0].children[bVar1];
  i._4_4_ = 0x4a;
  if (firstChar == '.') {
    i._4_4_ = 0x4b;
  }
  uStack_20 = 1;
  local_24 = peek();
  while (bVar2 = continuesIdentifier(local_24), bVar2) {
    shiftChar();
    if (uStack_20 < 0xff) {
      yylval.symName[uStack_20] = (char)local_24;
      if (local_24 == 0x2e) {
        i._4_4_ = 0x4b;
      }
      if (local_10 != 0) {
        bVar1 = dictIndex((char)local_24);
        local_10 = keywordDict[local_10].children[bVar1];
      }
    }
    uStack_20 = uStack_20 + 1;
    local_24 = peek();
  }
  if (0xff < uStack_20) {
    warning(WARNING_LONG_STR,"Symbol name too long, got truncated\n");
    uStack_20 = 0xff;
  }
  yylval.symName[uStack_20] = '\0';
  if (keywordDict[local_10].keyword == (KeywordMapping *)0x0) {
    tokenType = i._4_4_;
  }
  else {
    tokenType = (keywordDict[local_10].keyword)->token;
  }
  return tokenType;
}

Assistant:

static int readIdentifier(char firstChar)
{
	// Lex while checking for a keyword
	yylval.symName[0] = firstChar;
	uint16_t nodeID = keywordDict[0].children[dictIndex(firstChar)];
	int tokenType = firstChar == '.' ? T_LOCAL_ID : T_ID;
	size_t i = 1;

	// Continue reading while the char is in the symbol charset
	for (int c = peek(); continuesIdentifier(c); i++, c = peek()) {
		shiftChar();

		if (i < sizeof(yylval.symName) - 1) {
			// Write the char to the identifier's name
			yylval.symName[i] = c;

			// If the char was a dot, mark the identifier as local
			if (c == '.')
				tokenType = T_LOCAL_ID;

			// Attempt to traverse the tree to check for a keyword
			if (nodeID) // Do nothing if matching already failed
				nodeID = keywordDict[nodeID].children[dictIndex(c)];
		}
	}

	if (i > sizeof(yylval.symName) - 1) {
		warning(WARNING_LONG_STR, "Symbol name too long, got truncated\n");
		i = sizeof(yylval.symName) - 1;
	}
	yylval.symName[i] = '\0'; // Terminate the string

	if (keywordDict[nodeID].keyword)
		return keywordDict[nodeID].keyword->token;

	return tokenType;
}